

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::engine_common(engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                *this,function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *error_logger,function<void_(const_std::exception_&)> *exception_handler)

{
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->m_error_logger,error_logger);
  std::function<void_(const_std::exception_&)>::function
            (&this->m_exception_handler,exception_handler);
  (this->m_timer_quantities).m_single_shot_count = 0;
  (this->m_timer_quantities).m_periodic_count = 0;
  return;
}

Assistant:

engine_common(
		ERROR_LOGGER error_logger,
		ACTOR_EXCEPTION_HANDLER exception_handler )
		:	m_error_logger( error_logger )
		,	m_exception_handler( exception_handler )
	{}